

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

void __thiscall CP::list<int>::print(list<int> *this)

{
  bool bVar1;
  ostream *poVar2;
  int *piVar3;
  list_iterator local_30;
  list_iterator local_28;
  iterator it;
  iterator before;
  int i;
  list<int> *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Size ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->mSize);
  std::operator<<(poVar2,": ");
  list_iterator::list_iterator(&it);
  local_28.ptr = (node *)begin(this);
  while( true ) {
    local_30.ptr = (node *)end(this);
    bVar1 = list_iterator::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    piVar3 = list_iterator::operator*(&local_28);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar3);
    std::operator<<(poVar2," ");
    it.ptr = local_28.ptr;
    list_iterator::operator++(&local_28,0);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print() {
      std::cout << "Size " << mSize << ": ";
      int i = 0;
      iterator before;
      for (iterator it = begin();it!=end();before = it, it++,i++) {
        std::cout << *it << " ";
      }
      std::cout << std::endl;
    }